

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.h
# Opt level: O1

int ReleaseGlobals(void)

{
  long lVar1;
  CRITICAL_SECTION *pCVar2;
  char (*__s) [256];
  long lVar3;
  CRITICAL_SECTION *__mutex;
  char (*__s_00) [256];
  bool bVar4;
  
  bDeleteRoute = 1;
  nbwpstmp = 0;
  memset(wpstmplat,0,0x2000);
  memset(wpstmplong,0,0x2000);
  memset(wpstmpalt,0,0x2000);
  bWaypointsChanged = 1;
  nbWPs = 0;
  CurWP = 0;
  memset(wpslat,0,0x2000);
  memset(wpslong,0,0x2000);
  memset(wpsalt,0,0x2000);
  pthread_mutex_destroy((pthread_mutex_t *)&strtimeCS);
  pthread_mutex_destroy((pthread_mutex_t *)&RegistersCS);
  pthread_mutex_destroy((pthread_mutex_t *)&idsCS);
  pthread_mutex_destroy((pthread_mutex_t *)&OpenCVVideoRecordCS);
  pthread_mutex_destroy((pthread_mutex_t *)&OpenCVVideoCS);
  pthread_mutex_destroy((pthread_mutex_t *)&OpenCVGUICS);
  pthread_mutex_destroy((pthread_mutex_t *)&MissionFilesCS);
  pthread_mutex_destroy((pthread_mutex_t *)&StateVariablesCS);
  pthread_mutex_destroy((pthread_mutex_t *)&SeanetDataCS);
  pthread_mutex_destroy((pthread_mutex_t *)&SeanetConnectingCS);
  pthread_mutex_destroy((pthread_mutex_t *)&SeanetOverlayImgCS);
  pthread_mutex_destroy((pthread_mutex_t *)&MDMCS);
  pthread_mutex_destroy((pthread_mutex_t *)&FollowMeCS);
  lVar1 = 0x118;
  do {
    pthread_mutex_destroy((pthread_mutex_t *)((long)ExternalProgramTriggerCS + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  pthread_mutex_destroy((pthread_mutex_t *)&SonarAltitudeEstimationCS);
  lVar1 = (long)nbopencvgui;
  if (0 < lVar1) {
    lVar3 = lVar1 + 1;
    pCVar2 = dispimgsCS + lVar1;
    do {
      pCVar2 = pCVar2 + -1;
      pthread_mutex_destroy((pthread_mutex_t *)pCVar2);
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  __mutex = imgsCS + 4;
  pCVar2 = VideoRecordRequestsCS + 4;
  __s = videorecordfilenames + 4;
  __s_00 = endvideorecordfilenames + 4;
  lVar1 = 0;
  do {
    *(int *)((long)videorecordheight + lVar1 + 0x10) = videoimgheight;
    *(int *)((long)videorecordwidth + lVar1 + 0x10) = videoimgwidth;
    memset(__s_00,0,0x100);
    *(undefined8 *)((long)endvideorecordfiles + lVar1 * 2 + 0x20) = 0;
    memset(__s,0,0x100);
    *(undefined4 *)((long)bVideoRecordRestart + lVar1 + 0x10) = 0;
    *(undefined4 *)((long)VideoRecordRequests + lVar1 + 0x10) = 0;
    pthread_mutex_destroy((pthread_mutex_t *)pCVar2);
    *(undefined4 *)((long)bRestartVideo + lVar1 + 0x10) = 0;
    *(undefined4 *)((long)bPauseVideo + lVar1 + 0x10) = 0;
    *(undefined8 *)((long)xVideo + lVar1 * 2 + 0x20) = 0;
    *(undefined8 *)((long)yVideo + lVar1 * 2 + 0x20) = 0;
    *(undefined8 *)((long)zVideo + lVar1 * 2 + 0x20) = 0;
    *(undefined8 *)((long)phiVideo + lVar1 * 2 + 0x20) = 0;
    *(undefined8 *)((long)thetaVideo + lVar1 * 2 + 0x20) = 0;
    *(undefined8 *)((long)psiVideo + lVar1 * 2 + 0x20) = 0;
    *(undefined8 *)((long)VerticalBeamVideo + lVar1 * 2 + 0x20) = 0x4049000000000000;
    *(undefined8 *)((long)HorizontalBeamVideo + lVar1 * 2 + 0x20) = 0x4051800000000000;
    pthread_mutex_destroy((pthread_mutex_t *)__mutex);
    lVar1 = lVar1 + -4;
    __mutex = __mutex + -1;
    pCVar2 = pCVar2 + -1;
    __s = __s + -1;
    __s_00 = __s_00 + -1;
  } while (lVar1 != -0x14);
  bRestartPololu[2] = 0;
  bRestartPololu[0] = 0;
  bRestartPololu[1] = 0;
  bPausePololu[2] = 0;
  bPausePololu[0] = 0;
  bPausePololu[1] = 0;
  SetPositionMaestroPololu[0] = -1;
  SetPositionMaestroPololu[1] = -1;
  SetPositionMaestroPololu[2] = -1;
  ShowGetPositionMaestroPololu[0] = -1;
  ShowGetPositionMaestroPololu[1] = -1;
  ShowGetPositionMaestroPololu[2] = -1;
  bRestartRoboteq[0] = 0;
  bRestartRoboteq[1] = 0;
  bPauseRoboteq[0] = 0;
  bPauseRoboteq[1] = 0;
  bRestartMAVLinkDevice[2] = 0;
  bRestartMAVLinkDevice[0] = 0;
  bRestartMAVLinkDevice[1] = 0;
  bPauseMAVLinkDevice[2] = 0;
  bPauseMAVLinkDevice[0] = 0;
  bPauseMAVLinkDevice[1] = 0;
  GNSSqualityMAVLinkDevice[2] = 0;
  GNSSqualityMAVLinkDevice[0] = 0;
  GNSSqualityMAVLinkDevice[1] = 0;
  land_altitudeMAVLinkDevice[0] = 0.0;
  land_altitudeMAVLinkDevice[1] = 0.0;
  land_altitudeMAVLinkDevice[2] = 0.0;
  land_longitudeMAVLinkDevice[2] = 0.0;
  land_longitudeMAVLinkDevice[0] = 0.0;
  land_longitudeMAVLinkDevice[1] = 0.0;
  land_latitudeMAVLinkDevice[2] = 0.0;
  land_latitudeMAVLinkDevice[0] = 0.0;
  land_latitudeMAVLinkDevice[1] = 0.0;
  land_yawMAVLinkDevice[2] = 0.0;
  land_yawMAVLinkDevice[0] = 0.0;
  land_yawMAVLinkDevice[1] = 0.0;
  bLandMAVLinkDevice[2] = 0;
  bLandMAVLinkDevice[0] = 0;
  bLandMAVLinkDevice[1] = 0;
  takeoff_altitudeMAVLinkDevice[2] = 0.0;
  takeoff_altitudeMAVLinkDevice[0] = 0.0;
  takeoff_altitudeMAVLinkDevice[1] = 0.0;
  bTakeoffMAVLinkDevice[2] = 0;
  bTakeoffMAVLinkDevice[0] = 0;
  bTakeoffMAVLinkDevice[1] = 0;
  setattitudetargetthrustMAVLinkDevice[2] = 0.0;
  setattitudetargetthrustMAVLinkDevice[0] = 0.0;
  setattitudetargetthrustMAVLinkDevice[1] = 0.0;
  setattitudetargetyaw_rateMAVLinkDevice[2] = 0.0;
  setattitudetargetyaw_rateMAVLinkDevice[0] = 0.0;
  setattitudetargetyaw_rateMAVLinkDevice[1] = 0.0;
  setattitudetargetpitch_rateMAVLinkDevice[2] = 0.0;
  setattitudetargetpitch_rateMAVLinkDevice[0] = 0.0;
  setattitudetargetpitch_rateMAVLinkDevice[1] = 0.0;
  setattitudetargetroll_rateMAVLinkDevice[2] = 0.0;
  setattitudetargetroll_rateMAVLinkDevice[0] = 0.0;
  setattitudetargetroll_rateMAVLinkDevice[1] = 0.0;
  setattitudetargetyawMAVLinkDevice[2] = 0.0;
  setattitudetargetyawMAVLinkDevice[0] = 0.0;
  setattitudetargetyawMAVLinkDevice[1] = 0.0;
  setattitudetargetpitchMAVLinkDevice[2] = 0.0;
  setattitudetargetpitchMAVLinkDevice[0] = 0.0;
  setattitudetargetpitchMAVLinkDevice[1] = 0.0;
  setattitudetargetrollMAVLinkDevice[2] = 0.0;
  setattitudetargetrollMAVLinkDevice[0] = 0.0;
  setattitudetargetrollMAVLinkDevice[1] = 0.0;
  setattitudetargettypeMAVLinkDevice[2] = -1;
  setattitudetargettypeMAVLinkDevice[0] = -1;
  setattitudetargettypeMAVLinkDevice[1] = -1;
  setattitudetargetperiodMAVLinkDevice[2] = -1;
  setattitudetargetperiodMAVLinkDevice[0] = -1;
  setattitudetargetperiodMAVLinkDevice[1] = -1;
  iArmMAVLinkDevice[2] = -1;
  iArmMAVLinkDevice[0] = -1;
  iArmMAVLinkDevice[1] = -1;
  custom_modeMAVLinkDevice[2] = -1;
  custom_modeMAVLinkDevice[0] = -1;
  custom_modeMAVLinkDevice[1] = -1;
  bDisplayStatusTextMAVLinkDevice[2] = 0;
  bDisplayStatusTextMAVLinkDevice[0] = 0;
  bDisplayStatusTextMAVLinkDevice[1] = 0;
  bEnableMAVLinkDeviceIN[2] = 0;
  bEnableMAVLinkDeviceIN[0] = 0;
  bEnableMAVLinkDeviceIN[1] = 0;
  lVar1 = 2;
  do {
    RTCMuserslist.
    super__Vector_base<std::deque<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::deque<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         RTCMuserslist.
         super__Vector_base<std::deque<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::deque<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base
              (&(RTCMuserslist.
                 super__Vector_base<std::deque<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::deque<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>);
    bRestartublox[lVar1] = 0;
    bPauseublox[lVar1] = 0;
    GNSSqualityublox[lVar1] = 0;
    bVar4 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar4);
  bRestartNMEADevice[0] = 0;
  bRestartNMEADevice[1] = 0;
  bPauseNMEADevice[0] = 0;
  bPauseNMEADevice[1] = 0;
  GNSSqualityNMEADevice[0] = 0;
  GNSSqualityNMEADevice[1] = 0;
  bRestartBlueView[0] = 0;
  bRestartBlueView[1] = 0;
  bPauseBlueView[0] = 0;
  bPauseBlueView[1] = 0;
  return 0;
}

Assistant:

inline int ReleaseGlobals(void)
{
	int i = 0;

	bDeleteRoute = TRUE;
	nbwpstmp = 0;
	memset(wpstmplat, 0, MAX_NB_WP*sizeof(double));
	memset(wpstmplong, 0, MAX_NB_WP*sizeof(double));
	memset(wpstmpalt, 0, MAX_NB_WP*sizeof(double));
	bWaypointsChanged = TRUE;
	nbWPs = 0;
	CurWP = 0;
	memset(wpslat, 0, MAX_NB_WP*sizeof(double));
	memset(wpslong, 0, MAX_NB_WP*sizeof(double));
	memset(wpsalt, 0, MAX_NB_WP*sizeof(double));

	DeleteCriticalSection(&strtimeCS);

	DeleteCriticalSection(&RegistersCS);

	DeleteCriticalSection(&idsCS);

	DeleteCriticalSection(&OpenCVVideoRecordCS);
	DeleteCriticalSection(&OpenCVVideoCS);
	DeleteCriticalSection(&OpenCVGUICS);

	DeleteCriticalSection(&MissionFilesCS);

	DeleteCriticalSection(&StateVariablesCS);

#ifndef DISABLE_OPENCV_SUPPORT
	cvReleaseImage(&SeanetOverlayImg);
#endif // !DISABLE_OPENCV_SUPPORT
	DeleteCriticalSection(&SeanetDataCS);
	DeleteCriticalSection(&SeanetConnectingCS);
	DeleteCriticalSection(&SeanetOverlayImgCS);

	DeleteCriticalSection(&MDMCS);

	DeleteCriticalSection(&FollowMeCS);

	for (i = MAX_NB_EXTERNALPROGRAMTRIGGER-1; i >= 0; i--)
	{
		DeleteCriticalSection(&ExternalProgramTriggerCS[i]);
	}

#ifndef DISABLE_OPENCV_SUPPORT
	cvReleaseImage(&PingerOverlayImg);
	DeleteCriticalSection(&PingerOverlayImgCS);
	DeleteCriticalSection(&PingerCS);

	cvReleaseImage(&ObstacleOverlayImg);
	DeleteCriticalSection(&ObstacleOverlayImgCS);
	DeleteCriticalSection(&ObstacleCS);

	cvReleaseImage(&SurfaceVisualObstacleOverlayImg);
	DeleteCriticalSection(&SurfaceVisualObstacleOverlayImgCS);
	DeleteCriticalSection(&SurfaceVisualObstacleCS);
		
	for (i = MAX_NB_BALL-1; i >= 0; i--)
	{
		cvReleaseImage(&BallOverlayImg[i]);
		DeleteCriticalSection(&BallOverlayImgCS[i]);
		DeleteCriticalSection(&BallCS[i]);
	}

	cvReleaseImage(&WallOverlayImg);
	DeleteCriticalSection(&WallOverlayImgCS);
	DeleteCriticalSection(&WallCS);

	cvReleaseImage(&ExternalVisualLocalizationOverlayImg);
	DeleteCriticalSection(&ExternalVisualLocalizationOverlayImgCS);
	DeleteCriticalSection(&ExternalVisualLocalizationCS);
#endif // !DISABLE_OPENCV_SUPPORT

	DeleteCriticalSection(&SonarAltitudeEstimationCS);

	for (i = nbopencvgui-1; i >= 0; i--)
	{
#ifndef DISABLE_OPENCV_SUPPORT
		cvReleaseImage(&dispimgs[i]);
#endif // !DISABLE_OPENCV_SUPPORT
		DeleteCriticalSection(&dispimgsCS[i]);
	}

	for (i = MAX_NB_VIDEO-1; i >= 0; i--)
	{
		videorecordheight[i] = videoimgheight;
		videorecordwidth[i] = videoimgwidth;
		memset(endvideorecordfilenames[i], 0, sizeof(endvideorecordfilenames[i]));
		endvideorecordfiles[i] = NULL;
		memset(videorecordfilenames[i], 0, sizeof(videorecordfilenames[i]));
#ifndef DISABLE_OPENCV_SUPPORT
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		videorecordfiles[i] = NULL;
#endif // !USE_OPENCV_HIGHGUI_CPP_API
#endif // !DISABLE_OPENCV_SUPPORT
		bVideoRecordRestart[i] = FALSE;
		VideoRecordRequests[i] = 0;
		DeleteCriticalSection(&VideoRecordRequestsCS[i]);
		bRestartVideo[i] = FALSE;
		bPauseVideo[i] = FALSE;
		xVideo[i] = 0; yVideo[i] = 0; zVideo[i] = 0; phiVideo[i] = 0; thetaVideo[i] = 0; psiVideo[i] = 0;
		VerticalBeamVideo[i]  = 50;
		HorizontalBeamVideo[i] = 70;
#ifndef DISABLE_OPENCV_SUPPORT
		if (!bUseRawImgPtrVideo) cvReleaseImage(&imgs[i]); else cvReleaseImage(&imgsbak[i]); // imgsbak has been kept in case imgs was overwritten...
#endif // !DISABLE_OPENCV_SUPPORT
		DeleteCriticalSection(&imgsCS[i]);
	}

	for (i = MAX_NB_POLOLU-1; i >= 0; i--)
	{
		bRestartPololu[i] = FALSE;
		bPausePololu[i] = FALSE;
		SetPositionMaestroPololu[i] = -1;
		ShowGetPositionMaestroPololu[i] = -1;
	}

	for (i = MAX_NB_ROBOTEQ-1; i >= 0; i--)
	{
		bRestartRoboteq[i] = FALSE;
		bPauseRoboteq[i] = FALSE;
	}

	for (i = MAX_NB_MAVLINKDEVICE-1; i >= 0; i--)
	{
		bRestartMAVLinkDevice[i] = FALSE;
		bPauseMAVLinkDevice[i] = FALSE;
		GNSSqualityMAVLinkDevice[i] = 0;
		land_altitudeMAVLinkDevice[i] = 0;
		land_longitudeMAVLinkDevice[i] = 0;
		land_latitudeMAVLinkDevice[i] = 0;
		land_yawMAVLinkDevice[i] = 0;
		bLandMAVLinkDevice[i] = FALSE;
		takeoff_altitudeMAVLinkDevice[i] = 0;
		bTakeoffMAVLinkDevice[i] = FALSE;
		setattitudetargetthrustMAVLinkDevice[i] = 0;
		setattitudetargetyaw_rateMAVLinkDevice[i] = 0;
		setattitudetargetpitch_rateMAVLinkDevice[i] = 0;
		setattitudetargetroll_rateMAVLinkDevice[i] = 0;
		setattitudetargetyawMAVLinkDevice[i] = 0;
		setattitudetargetpitchMAVLinkDevice[i] = 0;
		setattitudetargetrollMAVLinkDevice[i] = 0;
		setattitudetargettypeMAVLinkDevice[i] = -1;
		setattitudetargetperiodMAVLinkDevice[i] = -1;
		iArmMAVLinkDevice[i] = -1;
		custom_modeMAVLinkDevice[i] = -1;
		bDisplayStatusTextMAVLinkDevice[i] = FALSE;
		bEnableMAVLinkDeviceIN[i] = FALSE;
	}

	for (i = MAX_NB_UBLOX-1; i >= 0; i--)
	{
		RTCMuserslist.pop_back();
		bRestartublox[i] = FALSE;
		bPauseublox[i] = FALSE;
		GNSSqualityublox[i] = 0;
	}

	for (i = MAX_NB_NMEADEVICE-1; i >= 0; i--)
	{
		bRestartNMEADevice[i] = FALSE;
		bPauseNMEADevice[i] = FALSE;
		GNSSqualityNMEADevice[i] = 0;
	}

	for (i = MAX_NB_BLUEVIEW-1; i >= 0; i--)
	{
		bRestartBlueView[i] = FALSE;
		bPauseBlueView[i] = FALSE;
	}

	return EXIT_SUCCESS;
}